

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_add1_or_set(ggml_context *ctx,ggml_cgraph *cgraph,size_t isrc,ggml_tensor *tensor)

{
  ggml_tensor *b;
  ggml_tensor *pgVar1;
  
  b = (cgraph->visited_hash_set).keys[isrc];
  if (b != (ggml_tensor *)0x0) {
    if (cgraph->grads[isrc] == (ggml_tensor *)0x0) {
      pgVar1 = ggml_repeat(ctx,tensor,b);
    }
    else {
      pgVar1 = ggml_add1_impl(ctx,cgraph->grads[isrc],tensor,
                              cgraph->grad_accs[isrc] != (ggml_tensor *)0x0);
    }
    cgraph->grads[isrc] = pgVar1;
    ggml_format_name(cgraph->grads[isrc],"grad for %s",b->name);
    ggml_build_forward_expand(cgraph,cgraph->grads[isrc]);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             0x1498,"GGML_ASSERT(%s) failed","src");
}

Assistant:

static void ggml_add1_or_set(
        struct ggml_context * ctx,
        struct ggml_cgraph  * cgraph,
        size_t                isrc,
        struct ggml_tensor  * tensor) {
    struct ggml_tensor * src = cgraph->visited_hash_set.keys[isrc];
    GGML_ASSERT(src);
    if (cgraph->grads[isrc]) {
        cgraph->grads[isrc] = ggml_add1_impl(ctx, cgraph->grads[isrc], tensor, cgraph->grad_accs[isrc]);
    } else {
        cgraph->grads[isrc] = ggml_repeat(ctx, tensor, src);
    }
    ggml_format_name(cgraph->grads[isrc], "grad for %s", src->name);
    ggml_build_forward_expand(cgraph, cgraph->grads[isrc]);
}